

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.hpp
# Opt level: O0

bool __thiscall rsg::IsWritableEntry::operator()(IsWritableEntry *this,ValueEntry *entry)

{
  Storage SVar1;
  Variable *this_00;
  ValueEntry *entry_local;
  IsWritableEntry *this_local;
  
  this_00 = ValueEntry::getVariable(entry);
  SVar1 = rsg::Variable::getStorage(this_00);
  if (((SVar1 == STORAGE_LOCAL) || (SVar1 == STORAGE_SHADER_OUT)) ||
     (SVar1 - STORAGE_PARAMETER_IN < 3)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator() (const ValueEntry* entry) const
	{
		switch (entry->getVariable()->getStorage())
		{
			case Variable::STORAGE_LOCAL:
			case Variable::STORAGE_SHADER_OUT:
			case Variable::STORAGE_PARAMETER_IN:
			case Variable::STORAGE_PARAMETER_OUT:
			case Variable::STORAGE_PARAMETER_INOUT:
				return true;

			default:
				return false;
		}
	}